

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

void __thiscall
Graph<unsigned_long,_scc::VectorType>::Node::dual_dfs
          (Node *this,
          vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
          *acc)

{
  bool bVar1;
  reference ppNVar2;
  Node *local_40;
  Node *local_38;
  Node *i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *__range2;
  vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
  *acc_local;
  Node *this_local;
  
  if ((this->visited & 1U) == 0) {
    this->visited = true;
    __end0 = std::
             vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
             ::begin(&this->dual_edges);
    i = (Node *)std::
                vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
                ::end(&this->dual_edges);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_*const_*,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
                                       *)&i), bVar1) {
      ppNVar2 = __gnu_cxx::
                __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_*const_*,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
                ::operator*(&__end0);
      local_38 = *ppNVar2;
      dual_dfs(local_38,acc);
      __gnu_cxx::
      __normal_iterator<const_Graph<unsigned_long,_scc::VectorType>::Node_*const_*,_std::vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>_>
      ::operator++(&__end0);
    }
    local_40 = this;
    std::
    vector<const_Graph<unsigned_long,_scc::VectorType>::Node_*,_std::allocator<const_Graph<unsigned_long,_scc::VectorType>::Node_*>_>
    ::push_back(acc,&local_40);
  }
  return;
}

Assistant:

void dual_dfs(std::vector<const Node *> &acc) const {
            if (visited) return;
            visited = true;
            for (auto i: dual_edges) {
                i->dual_dfs(acc);
            }
            acc.push_back(this);
        }